

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_limcounter(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  OBJ_INDEX_DATA *pOVar3;
  char *txt;
  char buf [200];
  char acStack_e8 [208];
  
  bVar1 = is_number(argument);
  if (bVar1) {
    uVar2 = atoi(argument);
    pOVar3 = get_obj_index(0);
    if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
      txt = "Not found.\n\r";
    }
    else {
      sprintf(acStack_e8,"Obj vnum %d,Max: %d, Count %d.",(ulong)uVar2,
              (ulong)(uint)(int)pOVar3->limtotal,(ulong)(uint)(int)pOVar3->limcount);
      send_to_char(acStack_e8,ch);
      txt = "\n\r";
    }
  }
  else {
    txt = "Only limstat by vnums.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_limcounter(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObjIndex;
	char buf[200];
	int vnum;

	if (!is_number(argument))
	{
		send_to_char("Only limstat by vnums.\n\r", ch);
		return;
	}

	vnum = atoi(argument);

	pObjIndex = get_obj_index(vnum);

	if (pObjIndex == nullptr)
	{
		send_to_char("Not found.\n\r", ch);
		return;
	}

	sprintf(buf, "Obj vnum %d,Max: %d, Count %d.", vnum, pObjIndex->limtotal, pObjIndex->limcount);
	send_to_char(buf, ch);
	send_to_char("\n\r", ch);
}